

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_charge_Test::TestBody(unitStrings_charge_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t uVar4;
  undefined1 *puVar5;
  char *pcVar6;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  ulong local_50;
  string local_48;
  undefined1 *local_28;
  undefined8 local_20;
  
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::A + 8),(unit_data *)(units::precise::s + 8));
  local_50 = (ulong)(uint)uVar2;
  uVar4 = 0x3ff0000000000000;
  local_58.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            (local_68,"to_string(precise::A * precise::s)","\"C\"",&local_48,(char (*) [2])0x1fef06)
  ;
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x177,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::A + 8),(unit_data *)(units::precise::hr + 8));
  local_50 = (ulong)(uint)uVar2;
  uVar4 = 0x40ac200000000000;
  local_58.data_ = (AssertHelperData *)0x40ac200000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            (local_68,"to_string(precise::A * precise::hr)","\"Ah\"",&local_48,
             (char (*) [3])0x1faf94);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x179,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::femto + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_3cd203af9ee75616;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x3d8faa7ab552a553;
  local_58.data_ = (AssertHelperData *)0x3d8faa7ab552a553;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::femto * precise::A * precise::hr)","\"fAh\"",&local_48,
             (char (*) [4])"fAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::quecto + 8),(unit_data *)(units::precise::A + 8))
  ;
  local_20 = (ulong)(uint)uVar2;
  local_28 = (undefined1 *)0x39b4484bfeebc2a0;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x3a71d38acb0d360f;
  local_58.data_ = (AssertHelperData *)0x3a71d38acb0d360f;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::quecto * precise::A * precise::hr)","\"qAh\"",&local_48,
             (char (*) [4])"qAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::pico + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_3d719799812dea11;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x3e2eec7bd512b572;
  local_58.data_ = (AssertHelperData *)0x3e2eec7bd512b572;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::pico * precise::A * precise::hr)","\"pAh\"",&local_48,
             (char (*) [4])"pAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::nano + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_3e112e0be826d695;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x3ece32f0ee144532;
  local_58.data_ = (AssertHelperData *)0x3ece32f0ee144532;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::nano * precise::A * precise::hr)","\"nAh\"",&local_48,
             (char (*) [4])"nAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::micro + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_3eb0c6f7a0b5ed8d;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x3f6d7dbf487fcb92;
  local_58.data_ = (AssertHelperData *)0x3f6d7dbf487fcb92;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::micro * precise::A * precise::hr)","\"uAh\"",&local_48,
             (char (*) [4])"uAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::milli + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_3f50624dd2f1a9fc;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  puVar5 = &DAT_400ccccccccccccd;
  local_58.data_ = (AssertHelperData *)&DAT_400ccccccccccccd;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,(uint64_t)puVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::milli * precise::A * precise::hr)","\"mAh\"",&local_48,
             (char (*) [4])"mAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x17f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::kilo + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = (undefined1 *)0x408f400000000000;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x414b774000000000;
  local_58.data_ = (AssertHelperData *)0x414b774000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::kilo * precise::A * precise::hr)","\"kAh\"",&local_48,
             (char (*) [4])"kAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x180,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::mega + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = &DAT_412e848000000000;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x41ead27480000000;
  local_58.data_ = (AssertHelperData *)0x41ead27480000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::mega * precise::A * precise::hr)","\"MAh\"",&local_48,
             (char (*) [4])"MAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x181,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::giga + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = (undefined1 *)0x41cdcd6500000000;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  puVar5 = &DAT_428a3185c5000000;
  local_58.data_ = (AssertHelperData *)&DAT_428a3185c5000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,(uint64_t)puVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::giga * precise::A * precise::hr)","\"GAh\"",&local_48,
             (char (*) [4])"GAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x182,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::tera + 8),(unit_data *)(units::precise::A + 8));
  local_20 = (ulong)(uint)uVar2;
  local_28 = (undefined1 *)0x426d1a94a2000000;
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)&local_20,(unit_data *)(units::precise::hr + 8));
  local_50 = CONCAT44(local_20._4_4_,uVar2);
  uVar4 = 0x4329945ca2620000;
  local_58.data_ = (AssertHelperData *)0x4329945ca2620000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_48,(units *)&local_58,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_68,"to_string(precise::tera * precise::A * precise::hr)","\"TAh\"",&local_48,
             (char (*) [4])"TAh");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x183,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  return;
}

Assistant:

TEST(stringToUnits, equivalents2)
{
    EXPECT_EQ(unit_from_string("in us"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("us in"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("[in_us]"), unit_from_string("inch - US"));
    EXPECT_EQ(unit_from_string("CXCUN[1]^-1"), unit_from_string("/[arb'U]"));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"), unit_from_string("CCID<sub>50</sub> "));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"),
        unit_from_string("CCID<sub>50<\\/sub> "));
    EXPECT_EQ(
        unit_from_string("/100 neutrophils"),
        unit_from_string("/100{neutrophils}"));
    EXPECT_EQ(unit_from_string("carat/cubic inch"), unit_from_string("ct/in3"));
    EXPECT_EQ(
        unit_from_string("10.(UN.S)/(CM5.M2)", case_insensitive),
        unit_from_string("10.uN.s/(cm5.m2)"));
    EXPECT_EQ(unit_from_string("imperial miles"), unit_from_string("mi_br"));
    EXPECT_EQ(unit_from_string("cup us"), precise::us::cup);
    EXPECT_EQ(unit_from_string(" per sec"), unit_from_string("/s"));
    EXPECT_EQ(unit_from_string("ampere-hour"), unit_from_string("A.h"));
    EXPECT_EQ(
        unit_from_string("mL/cm[H2O]"),
        unit_from_string("milliliter per centimeter of water"));
    EXPECT_EQ(unit_from_string("sq m"), unit_from_string("m2"));
    EXPECT_EQ(unit_from_string("U/ 12hrs"), unit_from_string("U/(12.h)"));
    EXPECT_EQ(unit_from_string("Ncm"), unit_from_string("N.cm"));
    EXPECT_EQ(unit_from_string("ohm reciprocal"), unit_from_string("mho"));
    EXPECT_EQ(unit_from_string("per mins"), unit_from_string("/min"));
    EXPECT_EQ(unit_from_string("/100 WBCs"), unit_from_string("/100{WBCs}"));

    EXPECT_EQ(
        unit_from_string("lumen meters squared"), unit_from_string("lm.m2"));
}